

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

void __thiscall TasgridWrapper::outputPoints(TasgridWrapper *this,output_points_mode mode)

{
  long lVar1;
  int *piVar2;
  int rows;
  vector<double,_std::allocator<double>_> points;
  vector<double,_std::allocator<double>_> local_30;
  
  if (((this->outfilename)._M_string_length == 0) && (this->printCout != true)) {
    return;
  }
  lVar1 = *(long *)&this->field_0x8;
  if (mode == needed) {
    if (lVar1 != 0) {
      rows = *(int *)(lVar1 + 0x48);
      goto LAB_00133030;
    }
  }
  else if (lVar1 != 0) {
    piVar2 = (int *)(lVar1 + 0x20);
    if (*(long *)(lVar1 + 0x28) == *(long *)(lVar1 + 0x30)) {
      piVar2 = (int *)(lVar1 + 0x48);
    }
    rows = *piVar2;
    goto LAB_00133030;
  }
  rows = 0;
LAB_00133030:
  if (mode == needed) {
    TasGrid::TasmanianSparseGrid::getNeededPoints(&local_30,&this->grid);
  }
  else {
    TasGrid::TasmanianSparseGrid::getPoints(&local_30,&this->grid);
  }
  writeMatrix(this,&this->outfilename,rows,this->num_dimensions,
              local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  printMatrix(this,rows,this->num_dimensions,
              local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,false);
  if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::outputPoints(output_points_mode mode) const{
    if (outfilename.empty() and not printCout) return;
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    auto points = (mode == output_points_mode::needed) ? grid.getNeededPoints() : grid.getPoints();
    writeMatrix(outfilename, num_points, num_dimensions, points.data());
    printMatrix(num_points, num_dimensions, points.data());
}